

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.hpp
# Opt level: O2

vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
* vkt::tessellation::readInterleavedData<vkt::tessellation::(anonymous_namespace)::PerPrimitive>
            (vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             *__return_storage_ptr__,int count,void *memory,int offset,int stride)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  allocator_type *__a;
  long lVar11;
  undefined4 in_register_00000034;
  size_type __n;
  PerPrimitive *__cur;
  pointer pPVar12;
  ulong uVar13;
  bool bVar14;
  
  __n = (size_type)count;
  std::
  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ::_S_check_init_len(__n,(allocator_type *)CONCAT44(in_register_00000034,count));
  std::
  _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ::_Vector_base(&__return_storage_ptr__->
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                 ,__n,__a);
  pPVar12 = (__return_storage_ptr__->
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
            )._M_impl.super__Vector_impl_data._M_start;
  while (bVar14 = __n != 0, __n = __n - 1, bVar14) {
    pPVar12->tessCoord[2].m_data[0] = 0.0;
    pPVar12->tessCoord[2].m_data[1] = 0.0;
    pPVar12->tessCoord[2].m_data[2] = 0.0;
    pPVar12->tessCoord[2].m_data[3] = 0.0;
    pPVar12->tessCoord[1].m_data[0] = 0.0;
    pPVar12->tessCoord[1].m_data[1] = 0.0;
    pPVar12->tessCoord[1].m_data[2] = 0.0;
    pPVar12->tessCoord[1].m_data[3] = 0.0;
    pPVar12->tessCoord[0].m_data[0] = 0.0;
    pPVar12->tessCoord[0].m_data[1] = 0.0;
    pPVar12->tessCoord[0].m_data[2] = 0.0;
    pPVar12->tessCoord[0].m_data[3] = 0.0;
    pPVar12->patchPrimitiveID = 0;
    pPVar12->primitiveID = 0;
    pPVar12->unused_padding[0] = 0;
    pPVar12->unused_padding[1] = 0;
    lVar11 = 0x10;
    do {
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)((long)pPVar12->unused_padding + lVar11 + -8));
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x40);
    pPVar12 = pPVar12 + 1;
  }
  (__return_storage_ptr__->
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  )._M_impl.super__Vector_impl_data._M_finish = pPVar12;
  pPVar12 = (__return_storage_ptr__->
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = 0;
  uVar13 = (ulong)(uint)count;
  if (count < 1) {
    uVar13 = uVar10;
  }
  for (; uVar13 * 0x40 != uVar10; uVar10 = uVar10 + 0x40) {
    puVar1 = (undefined8 *)((long)memory + uVar10 + (long)offset);
    uVar3 = *puVar1;
    uVar4 = puVar1[1];
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    uVar7 = puVar1[4];
    uVar8 = puVar1[5];
    uVar9 = puVar1[7];
    puVar2 = (undefined8 *)((long)pPVar12->tessCoord[2].m_data + uVar10);
    *puVar2 = puVar1[6];
    puVar2[1] = uVar9;
    puVar1 = (undefined8 *)((long)pPVar12->tessCoord[1].m_data + uVar10);
    *puVar1 = uVar7;
    puVar1[1] = uVar8;
    puVar1 = (undefined8 *)((long)pPVar12->tessCoord[0].m_data + uVar10);
    *puVar1 = uVar5;
    puVar1[1] = uVar6;
    puVar1 = (undefined8 *)((long)pPVar12->unused_padding + (uVar10 - 8));
    *puVar1 = uVar3;
    puVar1[1] = uVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> readInterleavedData (const int count, const void* memory, const int offset, const int stride)
{
	std::vector<T> results(count);
	const deUint8* pData = static_cast<const deUint8*>(memory) + offset;

	for (int i = 0; i < count; ++i)
	{
		deMemcpy(&results[i], pData, sizeof(T));
		pData += stride;
	}

	return results;
}